

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int GetOtherScanDataResponseRPLIDAR
              (RPLIDAR *pRPLIDAR,double *pDistances,double *pAngles,BOOL *pbNewScan,
              int *pNbMeasurements)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  double dVar4;
  byte bVar5;
  int iVar6;
  byte bVar7;
  uint uVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  uchar *puVar12;
  long lVar13;
  uchar *puVar14;
  byte bVar15;
  double dVar16;
  double dVar17;
  uchar databuf [132];
  
  bVar15 = 0;
  memset(databuf,0,0x84);
  iVar6 = pRPLIDAR->esversion;
  if (iVar6 == 0x85) {
LAB_0017755d:
    iVar6 = 0x54;
  }
  else {
    if (iVar6 != 0x84) {
      if (iVar6 != 0x82) goto LAB_001777a2;
      goto LAB_0017755d;
    }
    iVar6 = 0x84;
  }
  iVar6 = GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR,databuf,iVar6);
  if (iVar6 != 0) {
    return 1;
  }
  uVar8 = (databuf[3] & 0x7f) << 8;
  iVar6 = pRPLIDAR->esversion;
  if (iVar6 == 0x85) {
    puVar14 = pRPLIDAR->desdata_prev;
    bVar1 = pRPLIDAR->desdata_prev[3];
    bVar2 = pRPLIDAR->desdata_prev[2];
    *pbNewScan = (uint)(bVar1 >> 7);
    *pNbMeasurements = 0x28;
    dVar17 = (double)((uint)bVar2 | (bVar1 & 0x7f) << 8) * 0.015625;
    dVar16 = (double)(databuf[2] | uVar8) * 0.015625;
    for (lVar13 = 0; lVar13 != 0x28; lVar13 = lVar13 + 1) {
      uVar3 = *(ushort *)(pRPLIDAR->desdata_prev + lVar13 * 2 + 4);
      dVar4 = fmod_2PI_deg2rad(-(((double)(int)lVar13 *
                                 ((double)(~-(ulong)(dVar16 < dVar17) & (ulong)dVar16 |
                                          (ulong)(dVar16 + 360.0) & -(ulong)(dVar16 < dVar17)) -
                                 dVar17)) / 40.0 + dVar17));
      pAngles[lVar13] = dVar4;
      pDistances[lVar13] = (double)uVar3 / 1000.0;
    }
    lVar13 = 0x54;
    puVar12 = databuf;
  }
  else {
    if (iVar6 == 0x84) {
      puts(
          "A RPLIDAR is not responding correctly : Unhandled response descriptor, please try another scan mode or rebuild using RPLIDAR SDK. "
          );
      return 0x11;
    }
    if (iVar6 != 0x82) {
LAB_001777a2:
      puts("A RPLIDAR is not responding correctly : Unhandled response descriptor. ");
      return 1;
    }
    bVar1 = pRPLIDAR->esdata_prev[3];
    bVar2 = pRPLIDAR->esdata_prev[2];
    *pbNewScan = (uint)(bVar1 >> 7);
    *pNbMeasurements = 0x20;
    dVar17 = (double)((uint)bVar2 | (bVar1 & 0x7f) << 8) * 0.015625;
    dVar16 = (double)(databuf[2] | uVar8) * 0.015625;
    dVar16 = (double)(~-(ulong)(dVar16 < dVar17) & (ulong)dVar16 |
                     (ulong)(dVar16 + 360.0) & -(ulong)(dVar16 < dVar17)) - dVar17;
    puVar14 = pRPLIDAR->esdata_prev + 8;
    for (lVar13 = -0x20; lVar13 != 0; lVar13 = lVar13 + 2) {
      uVar3 = *(ushort *)(puVar14 + -4);
      bVar1 = puVar14[-1];
      bVar2 = puVar14[-6];
      bVar5 = (puVar14[-4] & 3) << 4;
      bVar10 = *puVar14 & 0xf;
      bVar9 = puVar14[-2] << 4;
      bVar7 = *puVar14 >> 4;
      bVar11 = (bVar10 | bVar5 & 0x1f) + 1;
      if (bVar5 < 0x20) {
        bVar11 = bVar10 | bVar5;
      }
      bVar5 = (bVar7 | bVar9 & 0x1f) + 1;
      if ((bVar9 & 0x30) < 0x20) {
        bVar5 = bVar7 | bVar9 & 0x3f;
      }
      dVar4 = fmod_2PI_deg2rad(-(((double)((int)lVar13 + 0x21) * dVar16 * 0.03125 + dVar17) -
                                (double)bVar11 * 0.125));
      pAngles[lVar13 + 0x20] = dVar4;
      dVar4 = fmod_2PI_deg2rad(-(((double)((int)lVar13 + 0x22) * dVar16 * 0.03125 + dVar17) -
                                (double)bVar5 * 0.125));
      pAngles[lVar13 + 0x21] = dVar4;
      pDistances[lVar13 + 0x20] = (double)(uVar3 >> 2) / 1000.0;
      pDistances[lVar13 + 0x21] = (double)(ushort)(CONCAT11(bVar1,bVar2) >> 2) / 1000.0;
      puVar14 = puVar14 + 5;
    }
    lVar13 = 0x54;
    puVar12 = databuf;
    puVar14 = pRPLIDAR->esdata_prev;
  }
  for (; lVar13 != 0; lVar13 = lVar13 + -1) {
    *puVar14 = *puVar12;
    puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
    puVar14 = puVar14 + (ulong)bVar15 * -2 + 1;
  }
  return 0;
}

Assistant:

inline int GetOtherScanDataResponseRPLIDAR(RPLIDAR* pRPLIDAR, double* pDistances, double* pAngles, BOOL* pbNewScan, int* pNbMeasurements)
{
	int j = 0;

#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#if !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	sl_lidar_response_measurement_node_hq_t nodes[NB_MEASUREMENTS_OTHER_SCAN_DATA_RESPONSE_RPLIDAR+MAX_NB_MEASUREMENTS_PER_SCAN_RPLIDAR];
#else
	sl_lidar_response_measurement_node_hq_t nodes[NB_MEASUREMENTS_OTHER_SCAN_DATA_RESPONSE_RPLIDAR];
#endif // !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	size_t nodesCount = sizeof(nodes)/sizeof(sl_lidar_response_measurement_node_hq_t);
	size_t nodesRead = 0;
	CHRONO chrono;

	*pNbMeasurements = NB_MEASUREMENTS_OTHER_SCAN_DATA_RESPONSE_RPLIDAR;

	StartChrono(&chrono);

	while ((int)nodesRead < *pNbMeasurements)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > pRPLIDAR->timeout)
		{
			printf("A RPLIDAR is not responding correctly : getScanDataWithIntervalHq() timeout. \n");
			return EXIT_TIMEOUT;
		}
		nodesCount = *pNbMeasurements-nodesRead;
		if (SL_IS_FAIL(pRPLIDAR->drv->getScanDataWithIntervalHq(nodes+nodesRead, nodesCount)))
		{
			uSleep(1000);
		}
		else nodesRead += nodesCount;
	}

	*pNbMeasurements = (int)nodesRead;

	// Analyze the data response.
	*pbNewScan = 0;

	//memset(pAngles, 0, nodesRead*sizeof(double));
	//memset(pDistances, 0, nodesRead*sizeof(double));
	for (j = 0; j < (int)nodesRead; j++)
	{
		*pbNewScan = (*pbNewScan) | (nodes[j].flag & SL_LIDAR_RESP_MEASUREMENT_SYNCBIT);

		// Convert in rad.
		pAngles[j] = fmod_2PI_deg2rad(-nodes[j].angle_z_q14*90.0/(1 << 14));

		// Convert in m.
		pDistances[j] = nodes[j].dist_mm_q2/4000.0;
	}
#else
	unsigned char databuf[max(max(NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR, NB_BYTES_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR), NB_BYTES_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)];
	unsigned short start_angle_q6 = 0;
	unsigned short start_angle_q6_prev = 0;

	unsigned short distance1 = 0; // Legacy.
	unsigned short distance2 = 0; // Legacy.
	char dtheta1_q3 = 0; // Legacy.
	char dtheta2_q3 = 0; // Legacy.
	double dtheta1 = 0; // Legacy.
	double dtheta2 = 0; // Legacy.
	double theta1 = 0; // Legacy.
	double theta2 = 0; // Legacy.

	//unsigned int major = 0, predict1 = 0, predict2 = 0; // Extended.

	unsigned short distance = 0; // Dense.
	double theta = 0; // Dense.

	// Receive the data response.
	memset(databuf, 0, sizeof(databuf));
	switch (pRPLIDAR->esversion)
	{
	case MEASUREMENT_CAPSULED_RESPONSE_RPLIDAR:
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, databuf, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		break;
	case MEASUREMENT_CAPSULED_ULTRA_RESPONSE_RPLIDAR:
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, databuf, NB_BYTES_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		break;
	case MEASUREMENT_DENSE_CAPSULED_RESPONSE_RPLIDAR:
		if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, databuf, NB_BYTES_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		break;
	default:
		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor. \n");
		return EXIT_FAILURE;
		//break;
	}

	start_angle_q6 = ((databuf[3] & 0x7F)<<8) | databuf[2];

	switch (pRPLIDAR->esversion)
	{
	case MEASUREMENT_CAPSULED_RESPONSE_RPLIDAR:
		// Analyze the previous data response.
		start_angle_q6_prev = ((pRPLIDAR->esdata_prev[3] & 0x7F)<<8) | pRPLIDAR->esdata_prev[2];
		*pbNewScan = pRPLIDAR->esdata_prev[3]>>7;

		*pNbMeasurements = NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;

		//memset(pAngles, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		//memset(pDistances, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		for (j = 0; j < NB_CABINS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR; j++)
		{
			distance1 = ((pRPLIDAR->esdata_prev[4+5*j+1]<<8)|pRPLIDAR->esdata_prev[4+5*j+0])>>2;
			distance2 = ((pRPLIDAR->esdata_prev[4+5*j+3]<<8)|pRPLIDAR->esdata_prev[5*j+2])>>2;
			dtheta1_q3 = ((pRPLIDAR->esdata_prev[4+5*j+0] & 0x03)<<4)|(pRPLIDAR->esdata_prev[4+5*j+4] & 0x0F);
			dtheta2_q3 = ((pRPLIDAR->esdata_prev[4+5*j+2] & 0x03)<<4)|(pRPLIDAR->esdata_prev[4+5*j+4]>>4);
			// Handle the sign bit...
			dtheta1 = ((dtheta1_q3 & 0x20)>>5)? (-~(dtheta1_q3 & 0x1F))/8.0: (dtheta1_q3 & 0x1F)/8.0;
			dtheta2 = ((dtheta2_q3 & 0x20)>>5)? (-~(dtheta2_q3 & 0x1F))/8.0: (dtheta2_q3 & 0x1F)/8.0;

			// k indexes in the formula of the documentation start at 1...
			theta1 = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*(2*j+1)/(NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)-dtheta1;
			theta2 = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*(2*j+2)/(NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)-dtheta2;

			// Convert in rad.
			pAngles[2*j+0] = fmod_2PI_deg2rad(-theta1);
			pAngles[2*j+1] = fmod_2PI_deg2rad(-theta2);

			// Convert in m.
			pDistances[2*j+0] = distance1/1000.0;
			pDistances[2*j+1] = distance2/1000.0;
		}
		memcpy(pRPLIDAR->esdata_prev, databuf, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		break;
	case MEASUREMENT_CAPSULED_ULTRA_RESPONSE_RPLIDAR:
		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor, please try another scan mode or rebuild using RPLIDAR SDK. \n");
		return EXIT_NOT_IMPLEMENTED;

		// Need to check SDK code...  		 

		//// Analyze the previous data response.
		//start_angle_q6_prev = ((pRPLIDAR->eesdata_prev[3] & 0x7F)<<8) | pRPLIDAR->eesdata_prev[2];
		//*pbNewScan = pRPLIDAR->eesdata_prev[3]>>7;

		//*pNbMeasurements = NB_MEASUREMENTS_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;

		////memset(pAngles, 0, NB_MEASUREMENTS_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		////memset(pDistances, 0, NB_MEASUREMENTS_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		//for (j = 0; j < NB_CABINS_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR; j++)
		//{
		//	major = ((pRPLIDAR->eesdata_prev[4+4*j+1] & 0x0F)<<8)|(pRPLIDAR->eesdata_prev[4+4*j+0]);
		//	predict1 = ((pRPLIDAR->eesdata_prev[4+4*j+2] & 0x03)<<6)|((pRPLIDAR->eesdata_prev[4+4*j+1] & 0xF0)>>4);
		//	predict2 = ((pRPLIDAR->eesdata_prev[4+4*j+3] & 0xFF)<<2)|((pRPLIDAR->eesdata_prev[4+4*j+2] & 0xC0)>>6);

		//	// k indexes in the formula of the documentation start at 1...
		//	theta = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*j/NB_MEASUREMENTS_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;

		//	// Convert in rad.
		//	pAngles[j] = fmod_2PI_deg2rad(-theta);

		//	// Convert in m.
		//	pDistances[j] = distance/1000.0;
		//}
		//memcpy(pRPLIDAR->eesdata_prev, databuf, NB_BYTES_EXTENDED_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		//break;
	case MEASUREMENT_DENSE_CAPSULED_RESPONSE_RPLIDAR:
		// Analyze the previous data response.
		start_angle_q6_prev = ((pRPLIDAR->desdata_prev[3] & 0x7F)<<8) | pRPLIDAR->desdata_prev[2];
		*pbNewScan = pRPLIDAR->desdata_prev[3]>>7;

		*pNbMeasurements = NB_MEASUREMENTS_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;

		//memset(pAngles, 0, NB_MEASUREMENTS_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		//memset(pDistances, 0, NB_MEASUREMENTS_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		for (j = 0; j < NB_CABINS_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR; j++)
		{
			distance = ((pRPLIDAR->desdata_prev[4+2*j+1]<<8)|pRPLIDAR->desdata_prev[4+2*j+0]);

			// k indexes in the formula of the documentation start at 1...
			theta = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*j/NB_MEASUREMENTS_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;

			// Convert in rad.
			pAngles[j] = fmod_2PI_deg2rad(-theta);

			// Convert in m.
			pDistances[j] = distance/1000.0;
		}
		memcpy(pRPLIDAR->desdata_prev, databuf, NB_BYTES_DENSE_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
		break;
	default:
		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor. \n");
		return EXIT_FAILURE;
		//break;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}